

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP4Reader::Init(BP4Reader *this)

{
  float fVar1;
  float fVar2;
  IO *pIVar3;
  _func_int *p_Var4;
  long lVar5;
  Seconds pollSeconds;
  Seconds timeoutSeconds;
  TimePoint timeoutInstant;
  string local_f8;
  string local_d8;
  pointer local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_Engine).m_OpenMode != Read) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Engine","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"BP4Reader","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Init","");
    std::operator+(&local_50,"BPFileReader only supports OpenMode::Read from",
                   &(this->super_Engine).m_Name);
    helper::Throw<std::invalid_argument>(&local_d8,&local_f8,&local_b0,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  pIVar3 = (this->super_Engine).m_IO;
  pIVar3->m_ReadStreaming = false;
  p_Var4 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"in call to BP4::Open to write","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  adios2::format::BPBase::Init
            ((BPBase *)((long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer + (long)p_Var4),
             &pIVar3->m_Parameters,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (*(this->super_Engine)._vptr_Engine[0x17])(this);
  helper::RaiseLimitNoFile();
  if (this->readMetadataFromFile == true) {
    p_Var4 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
    fVar1 = *(float *)(p_Var4 + 0x224 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer);
    local_d8._M_dataplus._M_p = (pointer)(double)fVar1;
    fVar2 = *(float *)(p_Var4 + 0x228 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer);
    local_f8._M_dataplus._M_p = (pointer)(double)fVar2;
    if (fVar1 < fVar2) {
      local_f8._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    }
    local_b8 = local_d8._M_dataplus._M_p;
    lVar5 = std::chrono::_V2::steady_clock::now();
    local_b0._M_dataplus._M_p = (pointer)((double)local_b8 * 1000000000.0 + (double)lVar5);
    OpenFiles(this,(TimePoint *)&local_b0,(Seconds *)&local_f8,(Seconds *)&local_d8);
    if (((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x268)
        [(long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer] == (_func_int)0x0) {
      local_50._M_dataplus._M_p = (pointer)(local_f8._M_dataplus._M_p / 10.0);
      InitBuffer(this,(TimePoint *)&local_b0,(Seconds *)&local_50,(Seconds *)&local_d8);
    }
  }
  return;
}

Assistant:

void BP4Reader::Init()
{
    if (m_OpenMode != Mode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "Init",
                                             "BPFileReader only "
                                             "supports OpenMode::Read from" +
                                                 m_Name);
    }
    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;

    m_BP4Deserializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    InitTransports();

    helper::RaiseLimitNoFile();
    if (readMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds(m_BP4Deserializer.m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds(m_BP4Deserializer.m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;

        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        if (!m_BP4Deserializer.m_Parameters.StreamReader)
        {
            /* non-stream reader gets as much steps as available now */
            InitBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        }
    }
}